

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::findxtname(Forth *this)

{
  Definition *pDVar1;
  size_type sVar2;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Xt local_50;
  Cell local_4c;
  Xt xtfound;
  Cell xt;
  uint address;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string wordBuffer;
  Forth *this_local;
  
  wordBuffer.field_2._8_8_ = this;
  requireDStackDepth(this,1,"FIND-XT-NAME");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,0x10,' ',&local_31);
  std::allocator<char>::~allocator(&local_31);
  xtfound = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  local_4c = getDataCell(this,xtfound);
  local_50 = findXt(this,local_4c);
  if (local_50 != 0) {
    pDVar1 = definitionsAt(this,local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               &pDVar1->name);
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  if (sVar2 < 0x10) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30
                      );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,0x10 - sVar2,' ',&local_71);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  if (this->writeToTarget == ToString) {
    std::operator<<((ostream *)&this->field_0x20,(string *)local_30);
  }
  else if (this->writeToTarget == ToStdCout) {
    std::operator<<((ostream *)&std::cout,(string *)local_30);
    std::ostream::flush();
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void  findxtname() {
			REQUIRE_DSTACK_DEPTH(1, "FIND-XT-NAME");
			std::string wordBuffer(16,' ');
			auto address = dStack.getTop(); pop();
			auto xt=CELL(getDataCell(address));
			auto xtfound=findXt(xt);
			//std::cout << std::endl << address << " "<< xt << " " << xtfound << std::endl;
			if(xtfound>0){
				wordBuffer=definitionsAt(xtfound).name;	
				//std::cerr << " more " << wordBuffer;
			} 
			if(wordBuffer.size()<16) {
			 wordBuffer.append(std::string(16-wordBuffer.size(), ' '));
			}

#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << wordBuffer  ;
				break;
			case ToStdCout:
				std::cout << wordBuffer ;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}